

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translit.cpp
# Opt level: O0

Transliterator * __thiscall
icu_63::Transliterator::operator=(Transliterator *this,Transliterator *other)

{
  int iVar1;
  undefined4 extraout_var;
  UnicodeFilter *local_28;
  Transliterator *other_local;
  Transliterator *this_local;
  
  icu_63::UnicodeString::operator=(&this->ID,&other->ID);
  icu_63::UnicodeString::getTerminatedBuffer(&this->ID);
  this->maximumContextLength = other->maximumContextLength;
  if (other->filter == (UnicodeFilter *)0x0) {
    local_28 = (UnicodeFilter *)0x0;
  }
  else {
    iVar1 = (*(other->filter->super_UnicodeFunctor).super_UObject._vptr_UObject[3])();
    local_28 = (UnicodeFilter *)CONCAT44(extraout_var,iVar1);
  }
  adoptFilter(this,local_28);
  return this;
}

Assistant:

Transliterator& Transliterator::operator=(const Transliterator& other) {
    ID = other.ID;
    // NUL-terminate the ID string
    ID.getTerminatedBuffer();

    maximumContextLength = other.maximumContextLength;
    adoptFilter((other.filter == 0) ? 0 : (UnicodeFilter*) other.filter->clone());
    return *this;
}